

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_ntop.c
# Opt level: O1

char * ares_inet_ntop(int af,void *src,char *dst,ares_socklen_t size)

{
  uint *puVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char *dst_00;
  ulong uVar14;
  ulong uVar15;
  char tmp [46];
  uint local_88 [8];
  char local_68 [46];
  undefined1 local_3a [10];
  
  pcVar3 = (char *)(ulong)size;
  if (af == 10) {
    local_88[4] = 0;
    local_88[5] = 0;
    local_88[6] = 0;
    local_88[7] = 0;
    local_88[0] = 0;
    local_88[1] = 0;
    local_88[2] = 0;
    local_88[3] = 0;
    bVar9 = 0;
    uVar11 = 0;
    do {
      bVar7 = ~bVar9;
      puVar1 = (uint *)((long)local_88 + (uVar11 & 0xfffffffffffffffe) * 2);
      *puVar1 = *puVar1 | (uint)*(byte *)((long)src + uVar11) << (bVar7 & 8);
      uVar11 = uVar11 + 1;
      bVar9 = bVar9 + 8;
    } while (uVar11 != 0x10);
    uVar12 = 0xffffffffffffffff;
    uVar13 = (ulong)(uint)(0 << (bVar7 & 8));
    uVar10 = 0;
    uVar11 = 0xffffffffffffffff;
    uVar14 = 0;
    do {
      if (local_88[uVar13] == 0) {
        uVar10 = uVar10 + 1;
        if (uVar12 == 0xffffffffffffffff) {
          uVar10 = 1;
          uVar12 = uVar13;
        }
      }
      else {
        uVar8 = uVar11;
        uVar15 = uVar14;
        if ((uVar12 != 0xffffffffffffffff) &&
           (uVar8 = uVar12, uVar15 = uVar10, uVar10 <= uVar14 && uVar11 != 0xffffffffffffffff)) {
          uVar8 = uVar11;
          uVar15 = uVar14;
        }
        uVar11 = uVar8;
        uVar12 = 0xffffffffffffffff;
        uVar14 = uVar15;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 8);
    if ((uVar12 != 0xffffffffffffffff) && (uVar14 < uVar10 || uVar11 == 0xffffffffffffffff)) {
      uVar11 = uVar12;
      uVar14 = uVar10;
    }
    uVar12 = 0xffffffffffffffff;
    if (1 < uVar14) {
      uVar12 = uVar11;
    }
    if (uVar11 == 0xffffffffffffffff) {
      uVar12 = uVar11;
    }
    dst_00 = local_68;
    uVar11 = 0;
    do {
      if ((uVar11 < uVar12) || (uVar12 + uVar14 <= uVar11)) {
        if (uVar11 != 0) {
          *dst_00 = ':';
          dst_00 = dst_00 + 1;
        }
        if ((uVar11 == 6 && uVar12 == 0) &&
           (((uVar14 == 6 || ((uVar14 == 7 && (local_88[7] != 1)))) ||
            ((uVar14 == 5 && (local_88[5] == 0xffff)))))) {
          pcVar5 = inet_ntop4((uchar *)((long)src + 0xc),dst_00,(size_t)(local_3a + -(long)dst_00));
          if (pcVar5 == (char *)0x0) {
            return (char *)0x0;
          }
          sVar6 = ares_strlen(dst_00);
          dst_00 = dst_00 + sVar6;
          break;
        }
        iVar2 = snprintf(dst_00,(size_t)(local_3a + -(long)dst_00),"%x",(ulong)local_88[uVar11]);
        dst_00 = dst_00 + iVar2;
      }
      else if (uVar12 == uVar11) {
        *dst_00 = ':';
        dst_00 = dst_00 + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != 8);
    if ((uVar12 != 0xffffffffffffffff) && (uVar12 + uVar14 == 8)) {
      *dst_00 = ':';
      dst_00 = dst_00 + 1;
    }
    *dst_00 = '\0';
    if (dst_00 + (1 - (long)local_68) <= pcVar3) {
      ares_strcpy(dst,local_68,(size_t)pcVar3);
      return dst;
    }
    piVar4 = __errno_location();
    *piVar4 = 0x1c;
  }
  else {
    if (af == 2) {
      pcVar3 = inet_ntop4((uchar *)src,dst,(size_t)pcVar3);
      return pcVar3;
    }
    piVar4 = __errno_location();
    *piVar4 = 0x61;
  }
  return (char *)0x0;
}

Assistant:

const char        *ares_inet_ntop(int af, const void *src, char *dst,
                                  ares_socklen_t size)
{
  switch (af) {
    case AF_INET:
      return inet_ntop4(src, dst, (size_t)size);
    case AF_INET6:
      return inet_ntop6(src, dst, (size_t)size);
    default:
      break;
  }
  SET_SOCKERRNO(EAFNOSUPPORT);
  return NULL;
}